

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  undefined1 local_d0 [8];
  secp256k1_gej tmpa;
  secp256k1_fe zs;
  size_t i;
  secp256k1_fe *zr_local;
  secp256k1_ge *a_local;
  size_t len_local;
  
  zs.n[4] = len - 1;
  if (len != 0) {
    secp256k1_fe_normalize_weak(&a[zs.n[4]].y);
    memcpy(&tmpa.infinity,zr + zs.n[4],0x28);
    while (zs.n[4] != 0) {
      if (zs.n[4] != len - 1) {
        secp256k1_fe_mul((secp256k1_fe *)&tmpa.infinity,(secp256k1_fe *)&tmpa.infinity,zr + zs.n[4])
        ;
      }
      zs.n[4] = zs.n[4] - 1;
      memcpy(local_d0,a + zs.n[4],0x28);
      memcpy(tmpa.x.n + 4,&a[zs.n[4]].y,0x28);
      tmpa.z.n[4]._0_4_ = 0;
      secp256k1_ge_set_gej_zinv
                (a + zs.n[4],(secp256k1_gej *)local_d0,(secp256k1_fe *)&tmpa.infinity);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i = len - 1;
    secp256k1_fe zs;

    if (len > 0) {
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            secp256k1_gej tmpa;
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            tmpa.x = a[i].x;
            tmpa.y = a[i].y;
            tmpa.infinity = 0;
            secp256k1_ge_set_gej_zinv(&a[i], &tmpa, &zs);
        }
    }
}